

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

int event_process_active_single_queue
              (event_base *base,evcallback_list *activeq,int max_to_process,timeval *endtime)

{
  uint8_t uVar1;
  ushort uVar2;
  event *ev;
  _func_void_int_short_void_ptr *p_Var3;
  long lVar4;
  long lVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 uVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar11;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  ulong uVar12;
  event *ev_00;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  int iVar16;
  timeval *tv;
  bool bVar17;
  timeval now;
  timeval local_50;
  int local_3c;
  evcallback_list *local_38;
  
  local_3c = max_to_process;
  local_38 = activeq;
  if (activeq == (evcallback_list *)0x0) {
    pcVar14 = "activeq != NULL";
    pcVar15 = "event_process_active_single_queue";
    uVar10 = 0x66f;
LAB_0026773b:
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,uVar10,pcVar14,pcVar15);
  }
  iVar16 = 0;
  do {
    ev = (event *)local_38->tqh_first;
    if (ev == (event *)0x0) {
      return iVar16;
    }
    if (((ev->ev_evcallback).evcb_flags & 0x80) == 0) {
      event_queue_remove_active(base,(event_callback *)ev);
      pvVar11 = extraout_RDX;
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("event_process_active: event_callback %p, closure %d, call %p",ev,
                      (ulong)(ev->ev_evcallback).evcb_closure,
                      (ev->ev_evcallback).evcb_cb_union.evcb_callback);
        pvVar11 = extraout_RDX_00;
      }
      ev_00 = (event *)0x0;
    }
    else {
      event_callback_to_event((event_callback *)ev);
      if (((ev->ev_events & 0x10) == 0) && (((ev->ev_evcallback).evcb_flags & 0x40) == 0)) {
        event_del_nolock_(ev,0);
        pvVar11 = extraout_RDX_01;
      }
      else {
        event_queue_remove_active(base,(event_callback *)ev);
        pvVar11 = extraout_RDX_02;
      }
      ev_00 = ev;
      if (event_debug_logging_mask_ != 0) {
        uVar2 = ev->ev_res;
        pcVar14 = "EV_READ ";
        if ((uVar2 & 2) == 0) {
          pcVar14 = " ";
        }
        pcVar15 = "EV_WRITE ";
        if ((uVar2 & 4) == 0) {
          pcVar15 = " ";
        }
        pcVar13 = "EV_CLOSED ";
        if (-1 < (char)uVar2) {
          pcVar13 = " ";
        }
        event_debugx_("event_process_active: event: %p, %s%s%scall %p",ev,pcVar14,pcVar15,pcVar13,
                      (ev->ev_evcallback).evcb_cb_union.evcb_callback);
        pvVar11 = extraout_RDX_03;
      }
    }
    iVar16 = iVar16 + (uint)(((ev->ev_evcallback).evcb_flags & 0x10U) == 0);
    base->current_event = (event_callback *)ev;
    base->current_event_waiters = 0;
    uVar1 = (ev->ev_evcallback).evcb_closure;
    switch(uVar1) {
    case '\0':
      if (ev_00 == (event *)0x0) {
        pcVar14 = "ev != NULL";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x69d;
        goto LAB_0026773b;
      }
      p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
      sVar6 = ev_00->ev_res;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*p_Var3)(ev_00->ev_fd,sVar6,(ev_00->ev_evcallback).evcb_arg);
      break;
    case '\x01':
      if (ev_00 == (event *)0x0) {
        pcVar14 = "ev != NULL";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x693;
        goto LAB_0026773b;
      }
      sVar6 = (ev_00->ev_).ev_signal.ev_ncalls;
      now.tv_sec = CONCAT62(now.tv_sec._2_6_,sVar6);
      if (sVar6 != 0) {
        (ev_00->ev_).ev_signal.ev_pncalls = (short *)&now;
      }
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      do {
        if ((short)now.tv_sec == 0) goto LAB_00267541;
        sVar6 = (short)now.tv_sec + -1;
        now.tv_sec = CONCAT62(now.tv_sec._2_6_,sVar6);
        (ev_00->ev_).ev_signal.ev_ncalls = sVar6;
        if (sVar6 == 0) {
          (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
        }
        (*(ev_00->ev_evcallback).evcb_cb_union.evcb_callback)
                  (ev_00->ev_fd,ev_00->ev_res,(ev_00->ev_evcallback).evcb_arg);
        if (base->th_base_lock == (void *)0x0) {
          iVar7 = base->event_break;
        }
        else {
          (*evthread_lock_fns_.lock)(0,base->th_base_lock);
          iVar7 = base->event_break;
          if (base->th_base_lock != (void *)0x0) {
            (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
          }
        }
      } while (iVar7 == 0);
      if ((short)now.tv_sec != 0) {
        (ev_00->ev_).ev_io.ev_timeout.tv_usec = 0;
      }
      break;
    case '\x02':
      if (ev_00 == (event *)0x0) {
        pcVar14 = "ev != NULL";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x697;
        goto LAB_0026773b;
      }
      uVar9 = (ev_00->ev_).ev_io.ev_timeout.tv_usec;
      if ((ev_00->ev_).ev_io.ev_timeout.tv_sec != 0 || uVar9 != 0) {
        if (0xfffff < (uVar9 ^ (ev_00->ev_timeout).tv_usec)) {
          pcVar14 = "is_same_common_timeout(&ev->ev_timeout, &ev->ev_io_timeout)";
          pcVar15 = "event_persist_closure";
          uVar10 = 0x632;
          goto LAB_0026773b;
        }
        tv = &ev_00->ev_timeout;
        gettime(base,&local_50);
        iVar7 = is_common_timeout(tv,base);
        uVar9 = (ev_00->ev_).ev_io.ev_timeout.tv_usec;
        if (iVar7 == 0) {
          if ((ev_00->ev_res & 1) == 0) {
            uVar8 = 0;
            goto LAB_00267469;
          }
          uVar12 = (ev_00->ev_timeout).tv_usec;
          uVar8 = 0;
        }
        else {
          uVar8 = (uint)uVar9 & 0xfff00000;
          uVar9 = (ulong)((uint)uVar9 & 0xfffff);
          if ((ev_00->ev_res & 1) == 0) {
LAB_00267469:
            tv = &local_50;
            uVar12 = local_50.tv_usec;
          }
          else {
            uVar12 = (ulong)((uint)(ev_00->ev_timeout).tv_usec & 0xfffff);
          }
        }
        lVar4 = (ev_00->ev_).ev_io.ev_timeout.tv_sec;
        now.tv_sec = tv->tv_sec + lVar4;
        uVar12 = uVar12 + uVar9;
        if (999999 < (long)uVar12) {
          now.tv_sec = now.tv_sec + 1;
          uVar12 = uVar12 - 1000000;
        }
        if (now.tv_sec == local_50.tv_sec) {
          if ((long)uVar12 < local_50.tv_usec) {
LAB_002674c3:
            now.tv_sec = local_50.tv_sec + lVar4;
            uVar12 = local_50.tv_usec + uVar9;
            if (999999 < (long)uVar12) {
              now.tv_sec = now.tv_sec + 1;
              uVar12 = uVar12 - 1000000;
            }
          }
        }
        else if (now.tv_sec < local_50.tv_sec) goto LAB_002674c3;
        now.tv_usec = uVar8 | uVar12;
        event_add_nolock_(ev_00,&now,1);
      }
      p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
      pvVar11 = (ev_00->ev_evcallback).evcb_arg;
      iVar7 = ev_00->ev_fd;
      sVar6 = ev_00->ev_res;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      }
      (*p_Var3)(iVar7,sVar6,pvVar11);
      break;
    case '\x03':
      p_Var3 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        pvVar11 = extraout_RDX_06;
      }
      (*p_Var3)((int)ev,(short)(ev->ev_evcallback).evcb_arg,pvVar11);
      break;
    case '\x04':
      p_Var3 = (ev->ev_evcallback).evcb_cb_union.evcb_callback;
      base->current_event = (event_callback *)0x0;
      if (((ev->ev_evcallback).evcb_flags & 0x40) == 0) {
        pcVar14 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x6bc;
        goto LAB_0026773b;
      }
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        pvVar11 = extraout_RDX_05;
      }
      (*p_Var3)((int)ev,(short)(ev->ev_evcallback).evcb_arg,pvVar11);
      break;
    case '\x05':
    case '\x06':
      if (ev_00 == (event *)0x0) {
        pcVar14 = "ev != NULL";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x6ae;
        goto LAB_0026773b;
      }
      base->current_event = (event_callback *)0x0;
      if (((ev->ev_evcallback).evcb_flags & 0x40) == 0) {
        pcVar14 = "(evcb->evcb_flags & EVLIST_FINALIZING)";
        pcVar15 = "event_process_active_single_queue";
        uVar10 = 0x6b1;
        goto LAB_0026773b;
      }
      p_Var3 = (ev_00->ev_evcallback).evcb_cb_union.evcb_callback;
      if (base->th_base_lock != (void *)0x0) {
        (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
        pvVar11 = extraout_RDX_04;
      }
      (*p_Var3)((int)ev_00,(short)(ev_00->ev_evcallback).evcb_arg,pvVar11);
      event_debug_note_teardown_(ev_00);
      if (uVar1 == '\x06') {
        event_mm_free_(ev_00);
      }
      break;
    default:
      pcVar14 = "0";
      pcVar15 = "event_process_active_single_queue";
      uVar10 = 0x6c2;
      goto LAB_0026773b;
    }
LAB_00267541:
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    base->current_event = (event_callback *)0x0;
    if (base->current_event_waiters != 0) {
      base->current_event_waiters = 0;
      if (base->current_event_cond != (void *)0x0) {
        (*evthread_cond_fns_.signal_condition)(base->current_event_cond,1);
      }
    }
    if (base->event_break != 0) {
      return -1;
    }
    if (local_3c <= iVar16) {
      return iVar16;
    }
    if ((endtime != (timeval *)0x0) && (iVar16 != 0)) {
      update_time_cache(base);
      gettime(base,&now);
      lVar4 = endtime->tv_sec;
      bVar17 = SBORROW8(now.tv_sec,lVar4);
      lVar5 = now.tv_sec - lVar4;
      if (now.tv_sec == lVar4) {
        bVar17 = SBORROW8(now.tv_usec,endtime->tv_usec);
        lVar5 = now.tv_usec - endtime->tv_usec;
      }
      if (bVar17 == lVar5 < 0) {
        return iVar16;
      }
    }
    if (base->event_continue != 0) {
      return iVar16;
    }
  } while( true );
}

Assistant:

static int
event_process_active_single_queue(struct event_base *base,
    struct evcallback_list *activeq,
    int max_to_process, const struct timeval *endtime)
{
	struct event_callback *evcb;
	int count = 0;

	EVUTIL_ASSERT(activeq != NULL);

	for (evcb = TAILQ_FIRST(activeq); evcb; evcb = TAILQ_FIRST(activeq)) {
		struct event *ev=NULL;
		if (evcb->evcb_flags & EVLIST_INIT) {
			ev = event_callback_to_event(evcb);

			if (ev->ev_events & EV_PERSIST || ev->ev_flags & EVLIST_FINALIZING)
				event_queue_remove_active(base, evcb);
			else
				event_del_nolock_(ev, EVENT_DEL_NOBLOCK);
			event_debug((
			    "event_process_active: event: %p, %s%s%scall %p",
			    ev,
			    ev->ev_res & EV_READ ? "EV_READ " : " ",
			    ev->ev_res & EV_WRITE ? "EV_WRITE " : " ",
			    ev->ev_res & EV_CLOSED ? "EV_CLOSED " : " ",
			    ev->ev_callback));
		} else {
			event_queue_remove_active(base, evcb);
			event_debug(("event_process_active: event_callback %p, "
				"closure %d, call %p",
				evcb, evcb->evcb_closure, evcb->evcb_cb_union.evcb_callback));
		}

		if (!(evcb->evcb_flags & EVLIST_INTERNAL))
			++count;


		base->current_event = evcb;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		base->current_event_waiters = 0;
#endif

		switch (evcb->evcb_closure) {
		case EV_CLOSURE_EVENT_SIGNAL:
			EVUTIL_ASSERT(ev != NULL);
			event_signal_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT_PERSIST:
			EVUTIL_ASSERT(ev != NULL);
			event_persist_closure(base, ev);
			break;
		case EV_CLOSURE_EVENT: {
			void (*evcb_callback)(evutil_socket_t, short, void *);
			short res;
			EVUTIL_ASSERT(ev != NULL);
			evcb_callback = *ev->ev_callback;
			res = ev->ev_res;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_callback(ev->ev_fd, res, ev->ev_arg);
		}
		break;
		case EV_CLOSURE_CB_SELF: {
			void (*evcb_selfcb)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_selfcb;
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_selfcb(evcb, evcb->evcb_arg);
		}
		break;
		case EV_CLOSURE_EVENT_FINALIZE:
		case EV_CLOSURE_EVENT_FINALIZE_FREE: {
			void (*evcb_evfinalize)(struct event *, void *);
			int evcb_closure = evcb->evcb_closure;
			EVUTIL_ASSERT(ev != NULL);
			base->current_event = NULL;
			evcb_evfinalize = ev->ev_evcallback.evcb_cb_union.evcb_evfinalize;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_evfinalize(ev, ev->ev_arg);
			event_debug_note_teardown_(ev);
			if (evcb_closure == EV_CLOSURE_EVENT_FINALIZE_FREE)
				mm_free(ev);
		}
		break;
		case EV_CLOSURE_CB_FINALIZE: {
			void (*evcb_cbfinalize)(struct event_callback *, void *) = evcb->evcb_cb_union.evcb_cbfinalize;
			base->current_event = NULL;
			EVUTIL_ASSERT((evcb->evcb_flags & EVLIST_FINALIZING));
			EVBASE_RELEASE_LOCK(base, th_base_lock);
			evcb_cbfinalize(evcb, evcb->evcb_arg);
		}
		break;
		default:
			EVUTIL_ASSERT(0);
		}

		EVBASE_ACQUIRE_LOCK(base, th_base_lock);
		base->current_event = NULL;
#ifndef EVENT__DISABLE_THREAD_SUPPORT
		if (base->current_event_waiters) {
			base->current_event_waiters = 0;
			EVTHREAD_COND_BROADCAST(base->current_event_cond);
		}
#endif

		if (base->event_break)
			return -1;
		if (count >= max_to_process)
			return count;
		if (count && endtime) {
			struct timeval now;
			update_time_cache(base);
			gettime(base, &now);
			if (evutil_timercmp(&now, endtime, >=))
				return count;
		}
		if (base->event_continue)
			break;
	}
	return count;
}